

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O0

array_t<unsigned_char,_16> __thiscall
CoreML::MilStoragePython::MilStoragePythonReader::read_uint2_data
          (MilStoragePythonReader *this,uint64_t offset)

{
  type m_reader;
  uint64_t in_RDX;
  uint64_t offset_local;
  MilStoragePythonReader *this_local;
  
  m_reader = std::
             unique_ptr<MILBlob::Blob::StorageReader,_std::default_delete<MILBlob::Blob::StorageReader>_>
             ::operator*((unique_ptr<MILBlob::Blob::StorageReader,_std::default_delete<MILBlob::Blob::StorageReader>_>
                          *)offset);
  anon_unknown.dwarf_392cf::readUnsignedSubByteData<MILBlob::UInt2>
            ((anon_unknown_dwarf_392cf *)this,m_reader,in_RDX);
  return (array)(array)this;
}

Assistant:

py::array_t<uint8_t> MilStoragePythonReader::read_uint2_data(uint64_t offset) {
    return readUnsignedSubByteData<MILBlob::UInt2>(*m_reader, offset);
}